

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_calc_verify_tls_sha384(mbedtls_ssl_context *ssl,uchar *hash)

{
  undefined1 local_f0 [8];
  mbedtls_sha512_context sha512;
  uchar *hash_local;
  mbedtls_ssl_context *ssl_local;
  
  sha512._208_8_ = hash;
  mbedtls_sha512_init((mbedtls_sha512_context *)local_f0);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x422,"=> calc verify sha384");
  mbedtls_sha512_clone((mbedtls_sha512_context *)local_f0,&ssl->handshake->fin_sha512);
  mbedtls_sha512_finish((mbedtls_sha512_context *)local_f0,(uchar *)sha512._208_8_);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x427,"calculated verify result",(uchar *)sha512._208_8_,0x30);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x428,"<= calc verify");
  mbedtls_sha512_free((mbedtls_sha512_context *)local_f0);
  return;
}

Assistant:

void ssl_calc_verify_tls_sha384( mbedtls_ssl_context *ssl, unsigned char hash[48] )
{
    mbedtls_sha512_context sha512;

    mbedtls_sha512_init( &sha512 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify sha384" ) );

    mbedtls_sha512_clone( &sha512, &ssl->handshake->fin_sha512 );
    mbedtls_sha512_finish( &sha512, hash );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 48 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_sha512_free( &sha512 );

    return;
}